

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.c
# Opt level: O1

int raviX_construct_cfg(Proc *proc)

{
  BasicBlock *block;
  int iVar1;
  Graph *g;
  Instruction *pIVar2;
  uint *puVar3;
  Proc *pPVar4;
  ulong uVar5;
  bool bVar6;
  PtrListIterator pseudoiter__;
  PtrListIterator PStack_48;
  
  g = raviX_init_graph(0,1,proc,proc->linearizer->compiler_state->allocator);
  if (proc->node_count != 0) {
    uVar5 = 0;
    do {
      block = proc->nodes[uVar5];
      pIVar2 = raviX_last_instruction(block);
      if (pIVar2 == (Instruction *)0x0) {
        bVar6 = false;
      }
      else if ((*(byte *)pIVar2 - 0x48 < 2) || (bVar6 = true, *(byte *)pIVar2 == 1)) {
        raviX_ptrlist_forward_iterator(&PStack_48,(PtrList *)pIVar2->targets);
        while (puVar3 = (uint *)raviX_ptrlist_iter_next(&PStack_48), puVar3 != (uint *)0x0) {
          if ((*puVar3 & 0xf) != 10) {
            __assert_fail("pseudo->type == PSEUDO_BLOCK",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/cfg.c"
                          ,0x2f,"int raviX_construct_cfg(Proc *)");
          }
          raviX_add_edge(g,block->index,**(nodeId_t **)(puVar3 + 2));
        }
        bVar6 = false;
      }
      if (bVar6) {
        return 1;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < proc->node_count);
  }
  proc->cfg = g;
  raviX_ptrlist_forward_iterator(&PStack_48,(PtrList *)proc->procs);
  pPVar4 = (Proc *)raviX_ptrlist_iter_next(&PStack_48);
  bVar6 = pPVar4 != (Proc *)0x0;
  if (bVar6) {
    iVar1 = raviX_construct_cfg(pPVar4);
    while (iVar1 == 0) {
      pPVar4 = (Proc *)raviX_ptrlist_iter_next(&PStack_48);
      bVar6 = pPVar4 != (Proc *)0x0;
      if (pPVar4 == (Proc *)0x0) break;
      iVar1 = raviX_construct_cfg(pPVar4);
    }
  }
  return (uint)bVar6;
}

Assistant:

int raviX_construct_cfg(Proc *proc)
{
	Graph *g = raviX_init_graph(ENTRY_BLOCK, EXIT_BLOCK, proc, proc->linearizer->compiler_state->allocator);
	for (unsigned i = 0; i < proc->node_count; i++) {
		BasicBlock *block = proc->nodes[i];
		Instruction *insn = raviX_last_instruction(block);
		if (insn == NULL)
			continue;
		if (insn->opcode == op_br || insn->opcode == op_cbr || insn->opcode == op_ret) {
			Pseudo *pseudo;
			FOR_EACH_PTR(insn->targets, Pseudo, pseudo)
			{
				assert(pseudo->type == PSEUDO_BLOCK);
				raviX_add_edge(g, block->index, pseudo->block->index);
			}
			END_FOR_EACH_PTR(pseudo)
		} else {
			return 1;
		}
	}
	proc->cfg = g;
	Proc *childproc;
	FOR_EACH_PTR(proc->procs, Proc, childproc)
	{
		if (raviX_construct_cfg(childproc) != 0)
			return 1;
	}
	END_FOR_EACH_PTR(childproc)
	return 0;
}